

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynNamespaceElement * __thiscall
ParseContext::IsNamespace(ParseContext *this,SynNamespaceElement *parent,InplaceStr name)

{
  SynNamespaceElement *pSVar1;
  InplaceStr name_00;
  bool bVar2;
  uint uVar3;
  SynNamespaceElement *pSVar4;
  uint uVar5;
  ulong uVar6;
  InplaceStr local_38;
  
  local_38.end = name.end;
  local_38.begin = name.begin;
  if (parent == (SynNamespaceElement *)0x0) {
    pSVar4 = (SynNamespaceElement *)&this->currentNamespace;
    uVar3 = (this->namespaceList).count;
    uVar5 = uVar3;
    do {
      pSVar4 = pSVar4->parent;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          pSVar1 = (this->namespaceList).data[uVar6];
          if (pSVar1->parent == pSVar4) {
            bVar2 = InplaceStr::operator==(&pSVar1->name->name,&local_38);
            if (bVar2) {
              return pSVar1;
            }
            uVar3 = (this->namespaceList).count;
          }
          uVar6 = uVar6 + 1;
          uVar5 = uVar3;
        } while (uVar6 < uVar3);
      }
    } while (pSVar4 != (SynNamespaceElement *)0x0);
  }
  else {
    uVar3 = (this->namespaceList).count;
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        pSVar4 = (this->namespaceList).data[uVar6];
        if (pSVar4->parent == parent) {
          bVar2 = InplaceStr::operator==(&pSVar4->name->name,&local_38);
          if (bVar2) {
            return pSVar4;
          }
          uVar3 = (this->namespaceList).count;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar3);
    }
    if (parent->parent != (SynNamespaceElement *)0x0) {
      name_00.end = local_38.end;
      name_00.begin = local_38.begin;
      pSVar4 = IsNamespace(this,parent->parent,name_00);
      return pSVar4;
    }
  }
  return (SynNamespaceElement *)0x0;
}

Assistant:

SynNamespaceElement* ParseContext::IsNamespace(SynNamespaceElement *parent, InplaceStr name)
{
	// In the context of a parent namespace, we only look for immediate children
	if(parent)
	{
		// Search for existing namespace in the same context
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == parent && ns->name->name == name)
				return ns;
		}

		// Try from context of the parent namespace
		if(parent->parent)
			return IsNamespace(parent->parent, name);

		return NULL;
	}

	// Go from the bottom of the namespace stack, trying to find the namespace there
	SynNamespaceElement *current = currentNamespace;

	for(;;)
	{
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == current && ns->name->name == name)
				return ns;
		}

		if(current)
			current = current->parent;
		else
			break;
	}

	return NULL;
}